

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__gcd
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  StackMemoryManager *this_00;
  xmlChar **ppxVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  gcd__AttributeData *pgVar5;
  StringHash SVar6;
  char **ppcVar7;
  xmlChar *text;
  bool failed;
  ParserChar *attributeValue;
  bool local_139;
  ParserChar *local_138;
  URI *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  URI *local_120;
  URI local_118;
  
  pgVar5 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::gcd__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (xmlChar *)0x0)) {
    local_120 = &pgVar5->href;
    local_128 = &pgVar5->_class;
    local_130 = &pgVar5->definitionURL;
    this_00 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
    do {
      SVar6 = GeneratedSaxParser::Utils::calculateStringHash(text);
      local_138 = ppxVar1[1];
      if ((long)SVar6 < 0x593f0c) {
        if (SVar6 == 0x6f4) {
          pgVar5->id = local_138;
        }
        else if (SVar6 == 0x6f8b6) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
          COLLADABU::URI::operator=(local_120,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_139 == true) &&
             (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x6d94,0x6f8b6,local_138), bVar3)) {
            return false;
          }
          if ((local_139 & 1U) == 0) {
            *(byte *)&pgVar5->present_attributes = (byte)pgVar5->present_attributes | 4;
          }
        }
        else {
          if (SVar6 != 0x7f8b6) goto LAB_00735046;
          pgVar5->xref = local_138;
        }
      }
      else if ((long)SVar6 < 0x7ac025) {
        if (SVar6 == 0x593f0c) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
          COLLADABU::URI::operator=(local_130,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_139 == true) &&
             (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x6d94,0x593f0c,local_138), bVar3))
          {
            return false;
          }
          if ((local_139 & 1U) == 0) {
            *(byte *)&pgVar5->present_attributes = (byte)pgVar5->present_attributes | 1;
          }
        }
        else if (SVar6 == 0x6a28a3) {
          bVar3 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                  ::
                  characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                            (&this->
                              super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                             ,local_138,local_128);
          if (bVar3) {
            *(byte *)&pgVar5->present_attributes = (byte)pgVar5->present_attributes | 2;
          }
          else {
            bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x6d94,0x6a28a3,local_138);
            if (bVar3) {
              return false;
            }
          }
        }
        else {
LAB_00735046:
          if ((pgVar5->unknownAttributes).data == (char **)0x0) {
            ppcVar7 = (char **)GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
          }
          else {
            ppcVar7 = (char **)GeneratedSaxParser::StackMemoryManager::growObject(this_00,0x10);
          }
          (pgVar5->unknownAttributes).data = ppcVar7;
          sVar2 = (pgVar5->unknownAttributes).size;
          ppcVar7[sVar2] = text;
          (pgVar5->unknownAttributes).data[sVar2 + 1] = local_138;
          (pgVar5->unknownAttributes).size = sVar2 + 2;
        }
      }
      else if (SVar6 == 0x7ac025) {
        pgVar5->style = local_138;
      }
      else {
        if (SVar6 != 0x4a5aa87) goto LAB_00735046;
        pgVar5->encoding = local_138;
      }
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (xmlChar *)0x0);
  }
  uVar4 = pgVar5->present_attributes;
  if ((uVar4 & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pgVar5->definitionURL,&local_118);
    COLLADABU::URI::~URI(&local_118);
    uVar4 = pgVar5->present_attributes;
  }
  if ((uVar4 & 2) == 0) {
    (pgVar5->_class).data = (ParserString *)0x0;
    (pgVar5->_class).size = 0;
  }
  if ((uVar4 & 4) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&pgVar5->href,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__gcd( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__gcd( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

gcd__AttributeData* attributeData = newData<gcd__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_GCD,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= gcd__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_GCD, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_GCD,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_GCD,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= gcd__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_GCD,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= gcd__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & gcd__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}
if ((attributeData->present_attributes & gcd__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & gcd__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}